

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O2

void __thiscall
boost::unit_test::output::junit_impl::junit_log_helper::clear(junit_log_helper *this)

{
  std::
  vector<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry,_std::allocator<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry>_>
  ::clear(&this->assertion_entries);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->system_out);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->system_err);
  (this->skipping_reason)._M_string_length = 0;
  *(this->skipping_reason)._M_dataplus._M_p = '\0';
  this->skipping = false;
  return;
}

Assistant:

void clear() {
          assertion_entries.clear();
          system_out.clear();
          system_err.clear();
          skipping_reason.clear();
          skipping = false;
      }